

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  uint uVar1;
  int iVar2;
  xmlCharEncConvFunc conv;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int toconv;
  int len;
  xmlChar charref [20];
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  xmlBufferPtr local_50;
  uchar local_48 [24];
  
  uVar1 = 0xffffffff;
  if (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0) {
    uVar1 = out->use;
    uVar4 = (ulong)uVar1;
    local_60 = out->size - uVar1;
    local_60 = local_60 - (uint)(0 < local_60);
    if (in == (xmlBufferPtr)0x0) {
      local_5c = 0;
      if (handler->output == (xmlCharEncodingOutputFunc)0x0) {
        local_60 = 0;
      }
      else {
        (*handler->output)(out->content + uVar4,&local_60,(uchar *)0x0,(int *)&local_5c);
        uVar1 = out->use;
      }
      out->use = uVar1 + local_60;
      out->content[uVar1 + local_60] = '\0';
      uVar1 = 0;
    }
    else {
      uVar5 = 0;
      local_50 = in;
      while( true ) {
        uVar1 = (uint)uVar4;
        local_5c = in->use;
        if (local_60 <= (int)(local_5c * 4)) {
          xmlBufferGrow(out,local_5c * 4);
          uVar1 = out->use;
          local_60 = ~uVar1 + out->size;
        }
        if (handler->output == (xmlCharEncodingOutputFunc)0x0) break;
        uVar1 = (*handler->output)(out->content + uVar1,&local_60,in->content,(int *)&local_5c);
        uVar1 = (int)uVar1 >> 0x1f & uVar1;
        xmlBufferShrink(in,local_5c);
        uVar3 = out->use + local_60;
        out->use = uVar3;
        uVar5 = uVar5 + local_60;
        out->content[uVar3] = '\0';
        if (uVar1 == 0xfffffffe) {
          local_58 = in->use;
          iVar2 = xmlGetUTF8Char(in->content,(int *)&local_58);
          if (iVar2 < 1) {
            return -2;
          }
          local_54 = uVar5;
          uVar1 = xmlSerializeDecCharRef((char *)local_48,iVar2);
          xmlBufferShrink(in,local_58);
          xmlBufferGrow(out,uVar1 * 4);
          local_60 = ~out->use + out->size;
          if (handler->output == (xmlCharEncodingOutputFunc)0x0) {
            return -1;
          }
          local_5c = uVar1;
          iVar2 = (*handler->output)(out->content + out->use,&local_60,local_48,(int *)&local_5c);
          if (iVar2 < 0) {
            return -1;
          }
          if (local_5c != uVar1) {
            return -1;
          }
          uVar1 = out->use + local_60;
          out->use = uVar1;
          uVar5 = local_54 + local_60;
          out->content[uVar1] = '\0';
          in = local_50;
        }
        else if (uVar1 != 0xfffffffd) goto LAB_0012d597;
        uVar4 = (ulong)out->use;
        local_60 = out->size - out->use;
        local_60 = local_60 - (uint)(0 < local_60);
      }
      local_60 = 0;
      local_5c = 0;
      xmlBufferShrink(in,0);
      uVar1 = out->use + local_60;
      out->use = uVar1;
      uVar5 = uVar5 + local_60;
      out->content[uVar1] = '\0';
      uVar1 = 0xffffffff;
LAB_0012d597:
      if (uVar5 != 0) {
        uVar1 = uVar5;
      }
    }
  }
  return uVar1;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;

    if (handler == NULL) return(XML_ENC_ERR_INTERNAL);
    if (out == NULL) return(XML_ENC_ERR_INTERNAL);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = in->use;
        const xmlChar *utf = (const xmlChar *) in->content;
        int cur, charrefLen;

        cur = xmlGetUTF8Char(utf, &len);
        if (cur <= 0)
            return(ret);

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufferShrink(in, len);
        xmlBufferGrow(out, charrefLen * 4);
        written = out->size - out->use - 1;
        toconv = charrefLen;
        ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                charref, &toconv);
        if ((ret < 0) || (toconv != charrefLen))
            return(XML_ENC_ERR_INTERNAL);

        out->use += written;
        writtentot += written;
        out->content[out->use] = 0;
        goto retry;
    }
    return(writtentot ? writtentot : ret);
}